

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  PFNGLNAMEDBUFFERSUBDATAPROC p_Var1;
  PFNGLNAMEDBUFFERDATAPROC p_Var2;
  int iVar3;
  GLuint GVar4;
  time_t tVar5;
  float *pfVar6;
  GLchar *pGVar7;
  GLchar *pGVar8;
  GLchar *pGVar9;
  ostream *poVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  tvec4<float,_(glm::precision)0> *ptVar15;
  vec2 current_cursor;
  double cursory;
  double cursorx;
  GLuint computeProgram;
  GLuint shaderProgram;
  GLchar infolog [512];
  GLuint computeShader;
  GLuint fragShader;
  GLuint vertShader;
  GLchar *computeCode;
  GLchar *fragCode;
  GLchar *vertCode;
  GLuint in_stack_ffffffffffcf2b98;
  GLuint cursor;
  GLuint vel;
  GLuint timebuffer;
  GLuint pos;
  GLuint vao;
  undefined8 in_stack_ffffffffffcf2bb0;
  undefined8 in_stack_ffffffffffcf2bb8;
  undefined8 in_stack_ffffffffffcf2bc0;
  float vely;
  float velx;
  float r;
  int i;
  vec4 velocities [100000];
  vec4 positions [100000];
  GLFWwindow *window;
  char **ppcStack_18;
  GLfloat delta_time;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  tVar5 = time((time_t *)0x0);
  srand((uint)tVar5);
  window._4_4_ = 0x3dcccccd;
  glfwInit();
  glfwWindowHint(0x22002,4);
  glfwWindowHint(0x22003,5);
  positions[99999].field_0._8_8_ =
       glfwCreateWindow(0x780,0x438,"particles",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  glfwMakeContextCurrent((GLFWwindow *)positions[99999].field_0._8_8_);
  glfwSwapInterval(1);
  gladLoadGL();
  ptVar15 = (tvec4<float,_(glm::precision)0> *)((long)&velocities[99999].field_0 + 8);
  do {
    glm::tvec4<float,_(glm::precision)0>::tvec4(ptVar15);
    ptVar15 = ptVar15 + 1;
  } while (ptVar15 != (tvec4<float,_(glm::precision)0> *)((long)&positions[99999].field_0 + 8));
  ptVar15 = (tvec4<float,_(glm::precision)0> *)&r;
  do {
    glm::tvec4<float,_(glm::precision)0>::tvec4(ptVar15);
    ptVar15 = ptVar15 + 1;
  } while (ptVar15 != (tvec4<float,_(glm::precision)0> *)((long)&velocities[99999].field_0 + 8));
  for (velx = 0.0; (int)velx < 100000; velx = (float)((int)velx + 1)) {
    iVar3 = rand();
    vely = ((float)iVar3 / 2.1474836e+09) * 8.0;
    dVar11 = (double)vely;
    dVar12 = sin((double)(int)velx);
    dVar13 = (double)vely;
    dVar14 = cos((double)(int)velx);
    glm::tvec4<float,_(glm::precision)0>::tvec4
              ((tvec4<float,_(glm::precision)0> *)&stack0xffffffffffcf2bb8,
               (float)((dVar11 * dVar12) / 10.0),(float)((dVar13 * dVar14) / 10.0),0.0,0.0);
    *(undefined8 *)((long)&velocities[(long)(int)velx + 99999].field_0 + 8) =
         in_stack_ffffffffffcf2bb8;
    *(undefined8 *)&positions[(int)velx].field_0 = in_stack_ffffffffffcf2bc0;
    glm::tvec4<float,_(glm::precision)0>::tvec4
              ((tvec4<float,_(glm::precision)0> *)&pos,0.0,0.0,0.0,0.0);
    *(undefined8 *)(&r + (long)(int)velx * 4) = _pos;
    *(undefined8 *)&velocities[(int)velx].field_0 = in_stack_ffffffffffcf2bb0;
  }
  (*glad_glCreateVertexArrays)(1,&timebuffer);
  (*glad_glBindVertexArray)(timebuffer);
  (*glad_glCreateBuffers)(1,&vel);
  (*glad_glCreateBuffers)(1,&cursor);
  (*glad_glCreateBuffers)(1,(GLuint *)&stack0xffffffffffcf2b98);
  (*glad_glCreateBuffers)(1,(GLuint *)((long)&vertCode + 4));
  (*glad_glNamedBufferData)(in_stack_ffffffffffcf2b98,1600000,&r,0x88e4);
  (*glad_glNamedBufferData)(vel,1600000,(void *)((long)&velocities[99999].field_0 + 8),0x88e4);
  (*glad_glNamedBufferData)(cursor,4,(void *)((long)&window + 4),0x88e8);
  GVar4 = vertCode._4_4_;
  p_Var2 = glad_glNamedBufferData;
  pfVar6 = glm::value_ptr<float,(glm::precision)0>(&defaultCursor);
  (*p_Var2)(GVar4,8,pfVar6,0x88e8);
  (*glad_glBindBufferBase)(0x90d2,0,vel);
  (*glad_glBindBufferBase)(0x90d2,1,in_stack_ffffffffffcf2b98);
  (*glad_glBindBufferBase)(0x90d2,2,vertCode._4_4_);
  (*glad_glBindBufferBase)(0x90d2,3,cursor);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffcf2b68,"shader.vert",(allocator *)&stack0xffffffffffcf2b67)
  ;
  pGVar7 = LoadShader((string *)&stack0xffffffffffcf2b68);
  std::__cxx11::string::~string((string *)&stack0xffffffffffcf2b68);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffcf2b67);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffcf2b28,"shader.frag",(allocator *)((long)&computeCode + 7))
  ;
  pGVar8 = LoadShader((string *)&stack0xffffffffffcf2b28);
  std::__cxx11::string::~string((string *)&stack0xffffffffffcf2b28);
  std::allocator<char>::~allocator((allocator<char> *)((long)&computeCode + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&vertShader,"cursor.glsl",(allocator *)((long)&fragShader + 3));
  pGVar9 = LoadShader((string *)&vertShader);
  std::__cxx11::string::~string((string *)&vertShader);
  std::allocator<char>::~allocator((allocator<char> *)((long)&fragShader + 3));
  GVar4 = (*glad_glCreateShader)(0x8b31);
  infolog._508_4_ = (*glad_glCreateShader)(0x8b30);
  infolog._504_4_ = (*glad_glCreateShader)(0x91b9);
  (*glad_glShaderSource)(GVar4,1,(GLchar **)&stack0xffffffffffcf2b88,(GLint *)0x0);
  (*glad_glShaderSource)(infolog._508_4_,1,(GLchar **)&stack0xffffffffffcf2b48,(GLint *)0x0);
  (*glad_glShaderSource)(infolog._504_4_,1,(GLchar **)&stack0xffffffffffcf2b18,(GLint *)0x0);
  (*glad_glCompileShader)(GVar4);
  (*glad_glGetShaderInfoLog)(GVar4,0x200,(GLsizei *)0x0,(GLchar *)&computeProgram);
  poVar10 = std::operator<<((ostream *)&std::cout,(char *)&computeProgram);
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  (*glad_glCompileShader)(infolog._508_4_);
  (*glad_glGetShaderInfoLog)(infolog._508_4_,0x200,(GLsizei *)0x0,(GLchar *)&computeProgram);
  poVar10 = std::operator<<((ostream *)&std::cout,(char *)&computeProgram);
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  (*glad_glCompileShader)(infolog._504_4_);
  (*glad_glGetShaderInfoLog)(infolog._504_4_,0x200,(GLsizei *)0x0,(GLchar *)&computeProgram);
  poVar10 = std::operator<<((ostream *)&std::cout,(char *)&computeProgram);
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  cursorx._4_4_ = (*glad_glCreateProgram)();
  (*glad_glAttachShader)(cursorx._4_4_,GVar4);
  (*glad_glAttachShader)(cursorx._4_4_,infolog._508_4_);
  (*glad_glLinkProgram)(cursorx._4_4_);
  (*glad_glDeleteShader)(GVar4);
  (*glad_glDeleteShader)(infolog._508_4_);
  (*glad_glGetProgramInfoLog)(cursorx._4_4_,0x200,(GLsizei *)0x0,(GLchar *)&computeProgram);
  poVar10 = std::operator<<((ostream *)&std::cout,(char *)&computeProgram);
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  cursorx._0_4_ = (*glad_glCreateProgram)();
  (*glad_glAttachShader)(cursorx._0_4_,infolog._504_4_);
  (*glad_glLinkProgram)(cursorx._0_4_);
  (*glad_glDeleteShader)(infolog._504_4_);
  (*glad_glGetProgramInfoLog)(cursorx._0_4_,0x200,(GLsizei *)0x0,(GLchar *)&computeProgram);
  poVar10 = std::operator<<((ostream *)&std::cout,(char *)&computeProgram);
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  (*glad_glViewport)(0,0,0x780,0x438);
  (*glad_glClearColor)(0.05,0.05,0.05,1.0);
  (*glad_glPointSize)(2.0);
  while( true ) {
    iVar3 = glfwWindowShouldClose((GLFWwindow *)positions[99999].field_0._8_8_);
    if (iVar3 != 0) break;
    (*glad_glClear)(0x4000);
    glfwPollEvents();
    glfwGetCursorPos((GLFWwindow *)positions[99999].field_0._8_8_,&cursory,(double *)&current_cursor
                    );
    cursory = ((cursory - 960.0) / 1920.0) * 2.0;
    current_cursor.field_0 =
         (anon_union_8_3_e2189aaa_for_tvec2<float,_(glm::precision)0>_2)
         ((((double)current_cursor.field_0 - 540.0) / 1080.0) * -2.0);
    glm::tvec2<float,(glm::precision)0>::tvec2<double,double>
              ((tvec2<float,(glm::precision)0> *)&stack0xffffffffffcf28c8,cursory,
               (double)current_cursor.field_0);
    GVar4 = vertCode._4_4_;
    p_Var1 = glad_glNamedBufferSubData;
    pfVar6 = glm::value_ptr<float,(glm::precision)0>
                       ((tvec2<float,_(glm::precision)0> *)&stack0xffffffffffcf28c8);
    (*p_Var1)(GVar4,0,8,pfVar6);
    (*glad_glUseProgram)(cursorx._0_4_);
    (*glad_glDispatchCompute)(100,1,1);
    (*glad_glUseProgram)(cursorx._4_4_);
    (*glad_glDrawArraysInstanced)(0,0,1,100000);
    glfwSwapBuffers((GLFWwindow *)positions[99999].field_0._8_8_);
  }
  (*glad_glDeleteProgram)(cursorx._4_4_);
  (*glad_glDeleteProgram)(cursorx._0_4_);
  if (pGVar7 != (GLchar *)0x0) {
    operator_delete__(pGVar7);
  }
  if (pGVar8 != (GLchar *)0x0) {
    operator_delete__(pGVar8);
  }
  if (pGVar9 != (GLchar *)0x0) {
    operator_delete__(pGVar9);
  }
  glfwDestroyWindow((GLFWwindow *)positions[99999].field_0._8_8_);
  glfwTerminate();
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  srand(time(0));

  const GLfloat delta_time = 0.1f;

  //Window Setup
  glfwInit();

  glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
  glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 5);

  GLFWwindow* window = glfwCreateWindow(SCREENX, SCREENY, "particles", nullptr, nullptr);
  glfwMakeContextCurrent(window);
  glfwSwapInterval(1);

  gladLoadGL();

  //Setup Initial Positions/Velocities
  glm::vec4 positions[NUM_PARTICLES];
  glm::vec4 velocities[NUM_PARTICLES];
  for(int i = 0; i < NUM_PARTICLES; i++) {
    float r = (float)rand() / RAND_MAX;
    r *= 8;
    float velx = r * sin(i) / 10;
    float vely = r * cos(i) / 10;
    positions[i] = glm::vec4(velx, vely, 0.0f, 0.0f);
    velocities[i] = glm::vec4(0.0f, 0.0f, 0.0f, 0.0f);
  }

  GLuint vao, pos, timebuffer, vel, cursor;

  /**
  * VAO Setup - Even though we'll be sourcing all of our positions from a shader storage buffer,
  * a VAO must be bound for drawing, so let's just create an empty one. We also don't need a VBO
  * since all our rendering will be points
  */
  glCreateVertexArrays(1, &vao);
  glBindVertexArray(vao);

  /**
  * Buffer setup - We'll need 4 SSBOs, one for the position of each point, one for velocity,
  * one for cursor position, and one for delta_time. As cursor and delta_time are small, these
  * could have been implemented using regular uniforms, but I opted for consistency instead
  */
  glCreateBuffers(1, &pos);
  glCreateBuffers(1, &timebuffer);
  glCreateBuffers(1, &vel);
  glCreateBuffers(1, &cursor);
  glNamedBufferData(vel, sizeof(velocities), velocities, GL_STATIC_DRAW);
  glNamedBufferData(pos, sizeof(positions), positions, GL_STATIC_DRAW);
  glNamedBufferData(timebuffer, sizeof(GLfloat), &delta_time, GL_DYNAMIC_DRAW);
  glNamedBufferData(cursor, 2 * sizeof(GLfloat), glm::value_ptr(defaultCursor), GL_DYNAMIC_DRAW);

  glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, pos);
  glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, vel);
  glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, cursor);
  glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 3, timebuffer);


  /*
  * Basic Shader Setup - This is standard shader loading and compilation. The only difference is that the compute
  * shader must be linked by itself in a separate program
  */
  const GLchar* vertCode = LoadShader("shader.vert");
  const GLchar* fragCode = LoadShader("shader.frag");
  const GLchar* computeCode = LoadShader("cursor.glsl");

  GLuint vertShader = glCreateShader(GL_VERTEX_SHADER);
  GLuint fragShader = glCreateShader(GL_FRAGMENT_SHADER);
  GLuint computeShader = glCreateShader(GL_COMPUTE_SHADER);

  glShaderSource(vertShader, 1, &vertCode, nullptr);
  glShaderSource(fragShader, 1, &fragCode, nullptr);
  glShaderSource(computeShader, 1, &computeCode, nullptr);
  GLchar infolog[512];
  glCompileShader(vertShader);
  glGetShaderInfoLog(vertShader, 512, nullptr, infolog);

  std::cout << infolog << std::endl;

  glCompileShader(fragShader);
  glGetShaderInfoLog(fragShader, 512, nullptr, infolog);
  std::cout << infolog << std::endl;

  glCompileShader(computeShader);
  glGetShaderInfoLog(computeShader, 512, nullptr, infolog);
  std::cout << infolog << std::endl;

  GLuint shaderProgram = glCreateProgram();
  glAttachShader(shaderProgram, vertShader);
  glAttachShader(shaderProgram, fragShader);
  glLinkProgram(shaderProgram);
  glDeleteShader(vertShader);
  glDeleteShader(fragShader);

  glGetProgramInfoLog(shaderProgram, 512, nullptr, infolog);

  std::cout << infolog << std::endl;

  GLuint computeProgram = glCreateProgram();
  glAttachShader(computeProgram, computeShader);
  glLinkProgram(computeProgram);
  glDeleteShader(computeShader);

  glGetProgramInfoLog(computeProgram, 512, nullptr, infolog);
  std::cout << infolog << std::endl;

  /**
  * Setup some basic properties for screen size, background color and point size
  * 2.0 Point Size was used to make it easier to see
  */
  glViewport(0, 0, SCREENX, SCREENY);
  glClearColor(0.05f, 0.05, 0.05f, 1.0f);
  glPointSize(2.0f);

  // Draw Loop
  while(glfwWindowShouldClose(window) == 0) {
    glClear(GL_COLOR_BUFFER_BIT);
    /**
    * Get our cursor coordinates in normalized device coordinates
    */
    glfwPollEvents();
    double cursorx;
    double cursory;
    glfwGetCursorPos(window, &cursorx, &cursory);

    cursorx = cursorx - (SCREENX / 2);
    cursorx /= SCREENX;
    cursorx *= 2;

    cursory = cursory - (SCREENY / 2);
    cursory /= SCREENY;
    cursory *= -2;

    /**
    * Copy over the cursor position into the buffer
    */
    glm::vec2 current_cursor = glm::vec2(cursorx, cursory);

    glNamedBufferSubData(cursor, 0, 2 * sizeof(GLfloat), glm::value_ptr(current_cursor));

    /**
    * Fire off our compute shader run. Since we want to simulate 100000 particles, and our work group size is 1000
    * we need to dispatch 100 work groups
    */
    glUseProgram(computeProgram);
    glDispatchCompute(NUM_PARTICLES / WORK_GROUP_SIZE, 1, 1);

    /**
    * Draw the particles
    */
    glUseProgram(shaderProgram);
    glDrawArraysInstanced(GL_POINTS, 0, 1, NUM_PARTICLES);


    glfwSwapBuffers(window);
  }

  /**
  * We're done now, just need to free up our resources
  */

  //OpenGL Shutdown
  glDeleteProgram(shaderProgram);
  glDeleteProgram(computeProgram);
  delete[] vertCode;
  delete[] fragCode;
  delete[] computeCode;

  //Window Shutdown
  glfwDestroyWindow(window);
  glfwTerminate();
  return 0;
}